

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlayout.cpp
# Opt level: O2

void QLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMargins *pQVar1;
  int iVar2;
  QMargins QVar3;
  
  if (_c == WriteProperty) {
    pQVar1 = (QMargins *)*_a;
    if (_id == 2) {
      setSizeConstraint((QLayout *)_o,(pQVar1->m_left).m_i);
      return;
    }
    if (_id == 1) {
      setContentsMargins((QLayout *)_o,pQVar1);
      return;
    }
    if (_id == 0) {
      (**(code **)(*(long *)_o + 0x68))(_o,(pQVar1->m_left).m_i);
      return;
    }
  }
  else if (_c == ReadProperty) {
    pQVar1 = (QMargins *)*_a;
    if (_id == 2) {
      iVar2 = *(int *)(*(long *)(_o + 8) + 0x90);
    }
    else {
      if (_id == 1) {
        QVar3 = contentsMargins((QLayout *)_o);
        *pQVar1 = QVar3;
        return;
      }
      if (_id != 0) {
        return;
      }
      iVar2 = (**(code **)(*(long *)_o + 0x60))();
    }
    (pQVar1->m_left).m_i = iVar2;
  }
  else if (_id == 1 && _c == ResetProperty) {
    unsetContentsMargins((QLayout *)_o);
    return;
  }
  return;
}

Assistant:

void QLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 1: *reinterpret_cast<QMargins*>(_v) = _t->contentsMargins(); break;
        case 2: *reinterpret_cast<SizeConstraint*>(_v) = _t->sizeConstraint(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setContentsMargins(*reinterpret_cast<QMargins*>(_v)); break;
        case 2: _t->setSizeConstraint(*reinterpret_cast<SizeConstraint*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->unsetContentsMargins(); break;
        default: break;
        }
    }
}